

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_data.h
# Opt level: O2

void __thiscall BindData::BindData(BindData *this,string *inside,string *outside,int flags)

{
  ContextManager *pCVar1;
  string local_50;
  
  memset(this,0,0x1009);
  memset(&this->outside_,0,0x1009);
  if (0x1000 < inside->_M_string_length) {
    pCVar1 = ContextManager::get();
    format_abi_cxx11_(&local_50,"bind inside path is larger that maximum (%zi > %zi)",
                      inside->_M_string_length,0x1000);
    (**pCVar1->_vptr_ContextManager)(pCVar1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (0x1000 < outside->_M_string_length) {
    pCVar1 = ContextManager::get();
    format_abi_cxx11_(&local_50,"bind outsize path is larger that maximum (%zi > %zi)",
                      outside->_M_string_length,0x1000);
    (**pCVar1->_vptr_ContextManager)(pCVar1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  PlainString<4096UL>::operator=(&this->inside_,inside);
  PlainString<4096UL>::operator=(&this->outside_,outside);
  this->flags_ = flags;
  return;
}

Assistant:

BindData(const std::string &inside, const std::string &outside, int flags) {
        if (inside.size() > inside_.max_size()) {
            die(format("bind inside path is larger that maximum (%zi > %zi)", inside.size(), inside_.max_size()));
        }
        if (outside.size() > outside_.max_size()) {
            die(format("bind outsize path is larger that maximum (%zi > %zi)", outside.size(), outside_.max_size()));
        }
        inside_ = inside;
        outside_ = outside;
        flags_ = flags;
    }